

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O0

void affect_check_area(AREA_DATA_conflict *area,int where,long *vector)

{
  bool bVar1;
  long *in_RDX;
  int in_ESI;
  long in_RDI;
  AREA_AFFECT_DATA *paf;
  undefined8 *local_20;
  
  if (in_RDX != (long *)0x0) {
    for (local_20 = *(undefined8 **)(in_RDI + 0x88); local_20 != (undefined8 *)0x0;
        local_20 = (undefined8 *)*local_20) {
      if ((*(short *)((long)local_20 + 0x12) == in_ESI) &&
         (bVar1 = vector_equal(local_20 + 4,in_RDX), bVar1)) {
        if (in_ESI != 0) {
          return;
        }
        BITWISE_OR((long *)(in_RDI + 0x78),in_RDX);
        return;
      }
    }
  }
  return;
}

Assistant:

void affect_check_area(AREA_DATA *area, int where, long vector[])
{
	AREA_AFFECT_DATA *paf;

	if (vector == 0)
		return;

	for (paf = area->affected; paf != nullptr; paf = paf->next)
	{
		if (paf->where == where && vector_equal(paf->bitvector, vector))
		{
			switch (where)
			{
				case TO_AREA_AFFECTS:
					BITWISE_OR(area->affected_by, vector);
					break;
			}

			return;
		}
	}
}